

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  ushort *puVar1;
  undefined2 uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  sbyte sVar6;
  int iVar7;
  BYTE *pBVar8;
  size_t sVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong *puVar17;
  int iVar18;
  byte *pbVar19;
  char cVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  size_t sVar27;
  byte *pbVar28;
  bool bVar29;
  bool bVar30;
  U64 bits [4];
  BYTE *pStart;
  BYTE *ip [4];
  HUF_DecompressFastArgs args;
  BIT_DStream_t local_1f8;
  byte *local_1d0;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  ulong *local_1b8;
  ulong *puStack_1b0;
  ulong *local_1a8;
  byte *local_1a0;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  byte *local_188;
  byte *pbStack_180;
  byte *local_178;
  ulong *local_170;
  byte *local_168;
  ushort *local_160;
  ulong local_158;
  ulong *local_150;
  ulong local_148;
  size_t local_140;
  byte *local_138;
  byte *local_130;
  byte *local_128;
  byte *local_120;
  ushort *local_118;
  byte *local_110;
  HUF_DecompressFastArgs local_108;
  size_t local_68;
  byte *local_60;
  byte *local_58;
  ulong *local_50;
  ulong *local_48;
  ulong local_40;
  ushort *local_38;
  
  if ((flags & 0x20U) == 0) {
    local_160 = (ushort *)cSrc;
    local_140 = HUF_DecompressFastArgs_init(&local_108,dst,dstSize,cSrc,cSrcSize,DTable);
    sVar9 = local_140;
    if (local_140 - 1 < 0xffffffffffffff88) {
      local_170 = (ulong *)cSrcSize;
      if (local_108.ip[0] < local_108.ilimit) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x329,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      puVar1 = local_160 + 3;
      local_1d0 = (byte *)((long)dst + dstSize);
      local_1f8.bitContainer = local_108.bits[0];
      local_1f8._8_8_ = local_108.bits[1];
      local_1f8.ptr = (char *)local_108.bits[2];
      local_1f8.start = (char *)local_108.bits[3];
      local_1c8 = (undefined1  [8])local_108.ip[0];
      uStack_1c0 = (ushort *)local_108.ip[1];
      local_1b8 = (ulong *)local_108.ip[2];
      puStack_1b0 = (ulong *)local_108.ip[3];
      local_198 = (undefined1  [8])local_108.op[0];
      uStack_190 = local_108.op[1];
      local_188 = local_108.op[2];
      pbStack_180 = local_108.op[3];
      lVar11 = 0;
      do {
        do {
          pBVar8 = local_108.oend;
          if (lVar11 != 3) {
            pBVar8 = (BYTE *)(&uStack_190)[lVar11];
          }
          if (pBVar8 < *(BYTE **)(local_198 + lVar11 * 8)) {
            __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2c9,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          if (*(ushort **)(local_1c8 + lVar11 * 8) < local_108.ilimit) {
            __assert_fail("ip[stream] >= ilimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                          ,0x2ca,
                          "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                         );
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        uVar12 = (ulong)((long)local_108.oend - (long)pbStack_180) / 5;
        uVar16 = (ulong)((long)local_1c8 - (long)local_108.ilimit) / 7;
        if (uVar12 < uVar16) {
          uVar16 = uVar12;
        }
        if ((long)(uVar16 * 5) < 0x14) {
          iVar7 = 2;
          bVar29 = false;
        }
        else {
          lVar11 = 1;
          do {
            bVar29 = *(byte **)(local_1c8 + lVar11 * 8) >= (&local_1d0)[lVar11];
            if (*(byte **)(local_1c8 + lVar11 * 8) < (&local_1d0)[lVar11]) {
              iVar7 = 10;
              goto LAB_008544f2;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          iVar7 = 0;
          bVar29 = true;
        }
LAB_008544f2:
        if (bVar29) {
          pbVar25 = pbStack_180 + uVar16 * 5;
          lVar11 = 1;
          do {
            if (*(byte **)(local_1c8 + lVar11 * 8) < (&local_1d0)[lVar11]) {
              __assert_fail("ip[stream] >= ip[stream - 1]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                            ,0x2ef,
                            "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                           );
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          lVar11 = 0;
          do {
            do {
              lVar13 = 0;
              do {
                uVar2 = *(undefined2 *)
                         ((long)local_108.dt + ((&local_1f8.bitContainer)[lVar13] >> 0x35) * 2);
                (&local_1f8.bitContainer)[lVar13] =
                     (&local_1f8.bitContainer)[lVar13] << ((byte)uVar2 & 0x3f);
                *(char *)(*(long *)(local_198 + lVar13 * 8) + lVar11) = (char)((ushort)uVar2 >> 8);
                lVar13 = lVar13 + 1;
              } while (lVar13 != 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 5);
            lVar11 = 0;
            do {
              uVar16 = (&local_1f8.bitContainer)[lVar11];
              if (uVar16 == 0) {
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                              ,0x5c,"unsigned int ZSTD_countTrailingZeros64(U64)");
              }
              uVar12 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                }
              }
              *(long *)(local_198 + lVar11 * 8) = *(long *)(local_198 + lVar11 * 8) + 5;
              puVar17 = (ulong *)(*(long *)(local_1c8 + lVar11 * 8) - (uVar12 >> 3 & 0x1fffffff));
              *(ulong **)(local_1c8 + lVar11 * 8) = puVar17;
              (&local_1f8.bitContainer)[lVar11] = (*puVar17 | 1) << ((byte)uVar12 & 7);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            lVar11 = 0;
            iVar7 = 0;
          } while (pbStack_180 < pbVar25);
        }
        lVar11 = 0;
      } while (iVar7 == 0);
      local_108.bits[2] = (U64)local_1f8.ptr;
      local_108.bits[3] = (U64)local_1f8.start;
      local_108.bits[0] = local_1f8.bitContainer;
      local_108.bits[1] = local_1f8._8_8_;
      local_108.ip[0] = (BYTE *)local_1c8;
      local_108.ip[1] = (BYTE *)uStack_1c0;
      local_108.ip[2] = (BYTE *)local_1b8;
      local_108.ip[3] = (BYTE *)puStack_1b0;
      local_108.op[2] = local_188;
      local_108.op[3] = pbStack_180;
      local_108.op[0] = (BYTE *)local_198;
      local_108.op[1] = uStack_190;
      if ((ulong)local_1c8 < puVar1) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x32f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (uStack_1c0 < puVar1) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x330,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_1b8 < puVar1) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x331,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (puStack_1b0 < puVar1) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x332,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (local_1d0 < pbStack_180) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x333,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      local_168 = (byte *)(dstSize + 3 >> 2);
      uVar16 = 0;
      bVar29 = false;
      sVar27 = local_140;
      local_1a0 = (byte *)dst;
      local_68 = dstSize;
LAB_00854664:
      lVar11 = -(long)dst;
      dst = (byte *)((long)dst + (long)local_168);
      if (local_1d0 + lVar11 < local_168) {
        dst = local_1d0;
      }
      sVar9 = HUF_initRemainingDStream(&local_1f8,&local_108,(int)uVar16,(BYTE *)dst);
      if (sVar9 < 0xffffffffffffff89) {
        pbVar25 = local_108.op[uVar16];
        lVar11 = (long)dst - (long)pbVar25;
        if (3 < lVar11) {
          do {
            if (local_1f8.bitsConsumed < 0x41) {
              if (local_1f8.ptr < local_1f8.limitPtr) {
                if (local_1f8.ptr == local_1f8.start) goto LAB_008546e5;
                bVar30 = local_1f8.start <=
                         (size_t *)((long)local_1f8.ptr - (ulong)(local_1f8.bitsConsumed >> 3));
                uVar24 = (int)local_1f8.ptr - (int)local_1f8.start;
                if (bVar30) {
                  uVar24 = local_1f8.bitsConsumed >> 3;
                }
                local_1f8.bitsConsumed = local_1f8.bitsConsumed + uVar24 * -8;
              }
              else {
                uVar24 = local_1f8.bitsConsumed >> 3;
                local_1f8.bitsConsumed = local_1f8.bitsConsumed & 7;
                bVar30 = true;
              }
              local_1f8.ptr = (char *)((long)local_1f8.ptr - (ulong)uVar24);
              local_1f8.bitContainer = *(size_t *)local_1f8.ptr;
            }
            else {
LAB_008546e5:
              bVar30 = false;
            }
            if (((byte *)((long)dst + -3) <= pbVar25) || (!bVar30)) goto LAB_0085480b;
            uVar12 = (local_1f8.bitContainer << ((byte)local_1f8.bitsConsumed & 0x3f)) >> 0x35;
            iVar7 = *(byte *)((long)DTable + uVar12 * 2 + 4) + local_1f8.bitsConsumed;
            *pbVar25 = *(byte *)((long)DTable + uVar12 * 2 + 5);
            uVar12 = (local_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> 0x35;
            iVar7 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar7;
            pbVar25[1] = *(byte *)((long)DTable + uVar12 * 2 + 5);
            uVar12 = (local_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> 0x35;
            iVar7 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar7;
            pbVar25[2] = *(byte *)((long)DTable + uVar12 * 2 + 5);
            uVar12 = (local_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> 0x35;
            local_1f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar7;
            pbVar25[3] = *(byte *)((long)DTable + uVar12 * 2 + 5);
            pbVar25 = pbVar25 + 4;
          } while( true );
        }
        if (local_1f8.bitsConsumed < 0x41) {
          if (local_1f8.ptr < local_1f8.limitPtr) {
            if (local_1f8.ptr == local_1f8.start) goto LAB_0085483d;
            uVar24 = (int)local_1f8.ptr - (int)local_1f8.start;
            if (local_1f8.start <=
                (size_t *)((long)local_1f8.ptr - (ulong)(local_1f8.bitsConsumed >> 3))) {
              uVar24 = local_1f8.bitsConsumed >> 3;
            }
            local_1f8.ptr = (char *)((long)local_1f8.ptr - (ulong)uVar24);
            local_1f8.bitsConsumed = local_1f8.bitsConsumed + uVar24 * -8;
          }
          else {
            local_1f8.ptr = (char *)((long)local_1f8.ptr - (ulong)(local_1f8.bitsConsumed >> 3));
            local_1f8.bitsConsumed = local_1f8.bitsConsumed & 7;
          }
          local_1f8.bitContainer = *(size_t *)local_1f8.ptr;
        }
        goto LAB_0085483d;
      }
      bVar30 = false;
      goto LAB_00854899;
    }
    goto LAB_008548dc;
  }
  goto LAB_008548e9;
LAB_0085480b:
  local_140 = sVar27;
LAB_0085483d:
  if (pbVar25 < dst) {
    lVar13 = 0;
    do {
      uVar12 = (local_1f8.bitContainer << ((byte)local_1f8.bitsConsumed & 0x3f)) >> 0x35;
      local_1f8.bitsConsumed = *(byte *)((long)DTable + uVar12 * 2 + 4) + local_1f8.bitsConsumed;
      pbVar25[lVar13] = *(byte *)((long)DTable + uVar12 * 2 + 5);
      lVar13 = lVar13 + 1;
    } while ((long)dst - (long)pbVar25 != lVar13);
  }
  pBVar8 = local_108.op[uVar16];
  local_108.op[uVar16] = pBVar8 + lVar11;
  bVar30 = pBVar8 + lVar11 == (BYTE *)dst;
  sVar9 = sVar27;
  if (!bVar30) {
    sVar9 = 0xffffffffffffffec;
  }
LAB_00854899:
  if (!bVar30) goto LAB_008548b6;
  bVar29 = 2 < uVar16;
  uVar16 = uVar16 + 1;
  sVar27 = sVar9;
  if (uVar16 == 4) goto LAB_008548b6;
  goto LAB_00854664;
LAB_008548b6:
  cSrcSize = (size_t)local_170;
  dst = local_1a0;
  dstSize = local_68;
  if ((bVar29) && (sVar9 = local_68, local_68 == 0)) {
    __assert_fail("dstSize != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                  ,0x348,
                  "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
LAB_008548dc:
  cSrc = local_160;
  if (sVar9 != 0) {
    return sVar9;
  }
LAB_008548e9:
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar3 = *cSrc;
  uVar22 = (ulong)uVar3;
  uVar4 = *(ushort *)((long)cSrc + 2);
  uVar12 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 4);
  uVar16 = (ulong)uVar5;
  uVar14 = uVar22 + uVar12 + uVar16 + 6;
  local_170 = (ulong *)(cSrcSize - uVar14);
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar14) {
    return 0xffffffffffffffec;
  }
  pbVar28 = (byte *)((long)dst + dstSize);
  local_140 = dstSize + 3 >> 2;
  local_138 = (byte *)((long)dst + local_140);
  local_128 = local_138 + local_140;
  pbVar25 = local_128 + local_140;
  if (pbVar28 < pbVar25) {
    return 0xffffffffffffffec;
  }
  local_1f8.start = (char *)((long)cSrc + uVar22 + 6);
  if (uVar22 == 0) {
    local_108.ip[2] = (BYTE *)0x0;
    local_108.ip[3] = (BYTE *)0x0;
    local_108.ip[0] = (byte *)0x0;
    local_108.ip[1]._0_4_ = 0;
    local_108.ip[1]._4_4_ = 0;
    local_108.op[0] = (BYTE *)0x0;
    uVar14 = 0xffffffffffffffb8;
  }
  else {
    local_108.ip[3] = (BYTE *)((long)cSrc + 6);
    local_108.op[0] = (BYTE *)((long)cSrc + 0xe);
    uVar14 = uVar22;
    if (uVar3 < 8) {
      local_108.ip[0] = (BYTE *)(ulong)(byte)*(ushort *)local_108.ip[3];
      switch(uVar3) {
      case 7:
        local_108.ip[0] =
             (BYTE *)((ulong)(byte)*(ushort *)((long)cSrc + 0xc) << 0x30 | (ulong)local_108.ip[0]);
      case 6:
        local_108.ip[0] = local_108.ip[0] + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
      case 5:
        local_108.ip[0] = local_108.ip[0] + ((ulong)(byte)*(ushort *)((long)cSrc + 10) << 0x20);
      case 4:
        local_108.ip[0] = local_108.ip[0] + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
      case 3:
        local_108.ip[0] = local_108.ip[0] + (ulong)(byte)*(ushort *)((long)cSrc + 8) * 0x10000;
      case 2:
        local_108.ip[0] = local_108.ip[0] + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
      default:
        bVar10 = *(byte *)((long)cSrc + uVar22 + 5);
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        local_108.ip[2] = local_108.ip[3];
        if (bVar10 == 0) {
          uVar14 = 0xffffffffffffffec;
          local_108.ip[1]._0_4_ = 0;
        }
        else {
          local_108.ip[1]._0_4_ = ~uVar24 + 9 + ((uint)uVar3 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      local_108.ip[2] = (BYTE *)((long)cSrc + uVar22 + -2);
      local_108.ip[0] = *(BYTE **)((long)cSrc + uVar22 + -2);
      bVar10 = *(byte *)((long)cSrc + uVar22 + 5);
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      local_108.ip[1]._0_4_ = ~uVar24 + 9;
      if (bVar10 == 0) {
        local_108.ip[1]._0_4_ = 0;
        uVar14 = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < uVar14) {
    return uVar14;
  }
  puStack_1b0 = (ulong *)((long)local_1f8.start + uVar12);
  if (uVar12 == 0) {
    local_1f8.ptr = (char *)0x0;
    local_1f8.start = (char *)0x0;
    local_1f8.bitContainer = 0;
    local_1f8.bitsConsumed = 0;
    local_1f8._12_4_ = 0;
    local_1f8.limitPtr = (char *)0x0;
    uVar12 = 0xffffffffffffffb8;
  }
  else {
    local_1f8.limitPtr = (char *)((long)cSrc + uVar22 + 0xe);
    if (uVar4 < 8) {
      local_1f8.bitContainer = (size_t)(byte)*(ulong *)local_1f8.start;
      switch(uVar4) {
      case 7:
        local_1f8.bitContainer =
             (ulong)*(byte *)((long)cSrc + uVar22 + 0xc) << 0x30 | local_1f8.bitContainer;
      case 6:
        local_1f8.bitContainer =
             local_1f8.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar22 + 0xb) << 0x28);
      case 5:
        local_1f8.bitContainer =
             local_1f8.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar22 + 10) << 0x20);
      case 4:
        local_1f8.bitContainer =
             local_1f8.bitContainer + (ulong)*(byte *)((long)cSrc + uVar22 + 9) * 0x1000000;
      case 3:
        local_1f8.bitContainer =
             local_1f8.bitContainer + (ulong)*(byte *)((long)cSrc + uVar22 + 8) * 0x10000;
      case 2:
        local_1f8.bitContainer =
             local_1f8.bitContainer + (ulong)*(byte *)((long)cSrc + uVar22 + 7) * 0x100;
      default:
        bVar10 = *(byte *)((long)puStack_1b0 + -1);
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        local_1f8.ptr = local_1f8.start;
        if (bVar10 == 0) {
          uVar12 = 0xffffffffffffffec;
          local_1f8.bitsConsumed = 0;
        }
        else {
          local_1f8.bitsConsumed = ~uVar24 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      local_1f8.bitContainer = puStack_1b0[-1];
      bVar10 = *(byte *)((long)puStack_1b0 + -1);
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      local_1f8.bitsConsumed = ~uVar24 + 9;
      local_1f8.ptr = (char *)(puStack_1b0 + -1);
      if (bVar10 == 0) {
        uVar12 = 0xffffffffffffffff;
        local_1f8.bitsConsumed = 0;
      }
    }
  }
  if (0xffffffffffffff88 < uVar12) {
    return uVar12;
  }
  pbStack_180 = (byte *)((long)puStack_1b0 + uVar16);
  if (uVar16 == 0) {
    local_1b8 = (ulong *)0x0;
    puStack_1b0 = (ulong *)0x0;
    local_1c8 = (undefined1  [8])0x0;
    uStack_1c0._0_4_ = 0;
    uStack_1c0._4_4_ = 0;
    local_1a8 = (ulong *)0x0;
    uVar16 = 0xffffffffffffffb8;
  }
  else {
    local_1a8 = puStack_1b0 + 1;
    if (uVar5 < 8) {
      local_1c8 = (undefined1  [8])(ulong)(byte)*puStack_1b0;
      switch(uVar5) {
      case 7:
        local_1c8 = (undefined1  [8])
                    ((ulong)*(byte *)((long)puStack_1b0 + 6) << 0x30 | (ulong)local_1c8);
      case 6:
        local_1c8 = (undefined1  [8])
                    ((long)local_1c8 + ((ulong)*(byte *)((long)puStack_1b0 + 5) << 0x28));
      case 5:
        local_1c8 = (undefined1  [8])
                    ((long)local_1c8 + ((ulong)*(byte *)((long)puStack_1b0 + 4) << 0x20));
      case 4:
        local_1c8 = (undefined1  [8])
                    ((long)local_1c8 + (ulong)*(byte *)((long)puStack_1b0 + 3) * 0x1000000);
      case 3:
        local_1c8 = (undefined1  [8])
                    ((long)local_1c8 + (ulong)*(byte *)((long)puStack_1b0 + 2) * 0x10000);
      case 2:
        local_1c8 = (undefined1  [8])
                    ((long)local_1c8 + (ulong)*(byte *)((long)puStack_1b0 + 1) * 0x100);
      default:
        bVar10 = pbStack_180[-1];
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        local_1b8 = puStack_1b0;
        if (bVar10 == 0) {
          uVar16 = 0xffffffffffffffec;
          uStack_1c0._0_4_ = 0;
        }
        else {
          uStack_1c0._0_4_ = ~uVar24 + 9 + ((uint)uVar5 * -8 + 0x40 & 0xffff);
        }
      }
    }
    else {
      local_1c8 = *(undefined1 (*) [8])(pbStack_180 + -8);
      bVar10 = pbStack_180[-1];
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uStack_1c0._0_4_ = ~uVar24 + 9;
      local_1b8 = (ulong *)(pbStack_180 + -8);
      if (bVar10 == 0) {
        uVar16 = 0xffffffffffffffff;
        uStack_1c0._0_4_ = 0;
      }
    }
  }
  if (0xffffffffffffff88 < uVar16) {
    return uVar16;
  }
  if (local_170 == (ulong *)0x0) {
    local_188 = (byte *)0x0;
    pbStack_180 = (byte *)0x0;
    local_198 = (undefined1  [8])0x0;
    uStack_190._0_4_ = 0;
    uStack_190._4_4_ = 0;
    local_178 = (byte *)0x0;
    puVar17 = (ulong *)0xffffffffffffffb8;
  }
  else {
    local_178 = pbStack_180 + 8;
    puVar17 = local_170;
    if (local_170 < (ulong *)0x8) {
      local_198 = (undefined1  [8])(ulong)*pbStack_180;
      switch(local_170) {
      case (ulong *)0x7:
        local_198 = (undefined1  [8])((ulong)pbStack_180[6] << 0x30 | (ulong)local_198);
      case (ulong *)0x6:
        local_198 = (undefined1  [8])((long)local_198 + ((ulong)pbStack_180[5] << 0x28));
      case (ulong *)0x5:
        local_198 = (undefined1  [8])((long)local_198 + ((ulong)pbStack_180[4] << 0x20));
      case (ulong *)0x4:
        local_198 = (undefined1  [8])((long)local_198 + (ulong)pbStack_180[3] * 0x800000 * 2);
      case (ulong *)0x3:
        local_198 = (undefined1  [8])((long)local_198 + (ulong)pbStack_180[2] * 0x8000 * 2);
      case (ulong *)0x2:
        local_198 = (undefined1  [8])((long)local_198 + (ulong)pbStack_180[1] * 0x80 * 2);
      default:
        bVar10 = (pbStack_180 + -1)[(long)local_170];
        uVar24 = 0x1f;
        if (bVar10 != 0) {
          for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        local_188 = pbStack_180;
        if (bVar10 == 0) {
          uStack_190._0_4_ = 0;
          puVar17 = (ulong *)0xffffffffffffffec;
        }
        else {
          uStack_190._0_4_ = ~uVar24 + (int)local_170 * -8 + 0x49;
        }
      }
    }
    else {
      local_188 = pbStack_180 + (long)local_170 + -8;
      local_198 = *(undefined1 (*) [8])local_188;
      bVar10 = (pbStack_180 + (long)local_170)[-1];
      uVar24 = 0x1f;
      if (bVar10 != 0) {
        for (; bVar10 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uStack_190._0_4_ = ~uVar24 + 9;
      if (bVar10 == 0) {
        uStack_190._0_4_ = 0;
        puVar17 = (ulong *)0xffffffffffffffff;
      }
    }
  }
  if ((ulong *)0xffffffffffffff88 < puVar17) {
    return (size_t)puVar17;
  }
  local_110 = (byte *)((long)dst + dstSize) + -3;
  uVar3 = *(ushort *)((long)DTable + 2);
  local_158 = (ulong)uVar3;
  cVar20 = (char)uVar3;
  pbVar15 = local_128;
  pbVar26 = local_138;
  pbVar19 = pbVar25;
  local_1a0 = (byte *)dst;
  local_60 = pbVar28;
  if (7 < (ulong)((long)pbVar28 - (long)pbVar25)) {
    local_168 = local_108.ip[0];
    local_148 = (ulong)local_1c8;
    local_160 = (ushort *)local_198;
    local_68 = dstSize;
    if (pbVar25 < local_110) {
      local_130 = pbVar25;
      if (cVar20 == '\0') goto LAB_00855eee;
      local_40 = (ulong)(-(uint)uVar3 & 0x3f);
      local_48 = (ulong *)local_1f8.limitPtr;
      local_50 = local_1a8;
      local_58 = local_178;
      local_38 = (ushort *)local_108.op[0];
      local_120 = local_188;
      local_170 = local_1b8;
      local_150 = (ulong *)local_1f8.ptr;
      local_118 = (ushort *)local_108.ip[2];
      local_1d0 = (byte *)(local_140 * 3);
      local_1a0 = (byte *)local_1f8.bitContainer;
      do {
        pbVar15 = (byte *)dst;
        sVar6 = (sbyte)(-(uint)uVar3 & 0x3f);
        uVar16 = (ulong)((long)local_168 << ((byte)(uint)local_108.ip[1] & 0x3f)) >> sVar6;
        iVar21 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)local_108.ip[1];
        *pbVar15 = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_1a0 << ((byte)local_1f8.bitsConsumed & 0x3f)) >> sVar6;
        iVar23 = *(byte *)((long)DTable + uVar16 * 2 + 4) + local_1f8.bitsConsumed;
        uVar12 = (local_148 << ((byte)(uint)uStack_1c0 & 0x3f)) >> sVar6;
        pbVar15[local_140] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_160 << ((byte)(uint)uStack_190 & 0x3f)) >> sVar6;
        iVar18 = *(byte *)((long)DTable + uVar12 * 2 + 4) + (uint)uStack_1c0;
        pbVar15[local_140 * 2] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_190;
        pbVar15[(long)local_1d0] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_168 << ((byte)iVar21 & 0x3f)) >> sVar6;
        iVar21 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar21;
        pbVar15[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_1a0 << ((byte)iVar23 & 0x3f)) >> sVar6;
        iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar23;
        uVar12 = (local_148 << ((byte)iVar18 & 0x3f)) >> sVar6;
        pbVar15[local_140 + 1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_160 << ((byte)iVar7 & 0x3f)) >> sVar6;
        iVar18 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar18;
        pbVar15[local_140 * 2 + 1] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
        pbVar15[(long)(local_1d0 + 1)] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_168 << ((byte)iVar21 & 0x3f)) >> sVar6;
        iVar21 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar21;
        pbVar15[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_1a0 << ((byte)iVar23 & 0x3f)) >> sVar6;
        iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar23;
        uVar12 = (local_148 << ((byte)iVar18 & 0x3f)) >> sVar6;
        pbVar15[local_140 + 2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_160 << ((byte)iVar7 & 0x3f)) >> sVar6;
        iVar18 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar18;
        pbVar15[local_140 * 2 + 2] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
        pbVar15[(long)(local_1d0 + 2)] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        uVar16 = (ulong)((long)local_168 << ((byte)iVar21 & 0x3f)) >> sVar6;
        local_108.ip[1]._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar21;
        uVar14 = (ulong)((long)local_1a0 << ((byte)iVar23 & 0x3f)) >> sVar6;
        uVar12 = (local_148 << ((byte)iVar18 & 0x3f)) >> sVar6;
        pbVar15[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        local_1f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar14 * 2 + 4) + iVar23;
        pbVar15[local_140 + 3] = *(byte *)((long)DTable + uVar14 * 2 + 5);
        uStack_1c0._0_4_ = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar18;
        uVar16 = (ulong)((long)local_160 << ((byte)iVar7 & 0x3f)) >> sVar6;
        pbVar15[local_140 * 2 + 3] = *(byte *)((long)DTable + uVar12 * 2 + 5);
        uStack_190._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
        pbVar15[(long)(local_1d0 + 3)] = *(byte *)((long)DTable + uVar16 * 2 + 5);
        iVar7 = 3;
        local_1f8.bitContainer = (size_t)local_1a0;
        if (local_108.op[0] <= local_118) {
          if ((uint)local_108.ip[1] < 0x41) {
            local_108.ip[2] = (BYTE *)((long)local_118 - (ulong)((uint)local_108.ip[1] >> 3));
            local_108.ip[1]._0_4_ = (uint)local_108.ip[1] & 7;
            local_168 = *(byte **)local_108.ip[2];
            iVar23 = 0;
            goto LAB_00855291;
          }
          local_108.ip[2] = (BYTE *)local_118;
LAB_0085605e:
          local_108.ip[0] = local_168;
LAB_0085612c:
          local_188 = local_120;
          local_1c8 = (undefined1  [8])local_148;
          local_198 = (undefined1  [8])local_160;
          local_1f8.ptr = (char *)local_150;
          local_1b8 = local_170;
          local_168 = local_108.ip[0];
          __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                        ,0x185,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
        }
        iVar23 = 3;
        local_108.ip[2] = (BYTE *)local_118;
LAB_00855291:
        if (local_1f8.limitPtr <= local_150) {
          if (0x40 < local_1f8.bitsConsumed) goto LAB_0085605e;
          local_150 = (ulong *)((long)local_150 - (ulong)(local_1f8.bitsConsumed >> 3));
          local_1f8.bitsConsumed = local_1f8.bitsConsumed & 7;
          iVar7 = 0;
          local_1f8.bitContainer = *local_150;
        }
        iVar18 = 3;
        local_118 = (ushort *)local_108.ip[2];
        if (local_170 < local_1a8) {
          iVar21 = 3;
        }
        else {
          if (0x40 < (uint)uStack_1c0) {
            local_108.ip[0] = local_168;
            goto LAB_0085612c;
          }
          local_170 = (ulong *)((long)local_170 - (ulong)((uint)uStack_1c0 >> 3));
          uStack_1c0._0_4_ = (uint)uStack_1c0 & 7;
          local_148 = *local_170;
          iVar21 = 0;
        }
        if (local_178 <= local_120) {
          if (0x40 < (uint)uStack_190) {
            local_108.ip[0] = local_168;
            goto LAB_0085612c;
          }
          local_120 = local_120 + -(ulong)((uint)uStack_190 >> 3);
          uStack_190._0_4_ = (uint)uStack_190 & 7;
          local_160 = *(ushort **)local_120;
          iVar18 = 0;
        }
      } while ((pbVar15 + (long)(local_1d0 + 4) < local_110) &&
              (dst = pbVar15 + 4, local_1a0 = (byte *)local_1f8.bitContainer,
              ((iVar7 == 0 && iVar23 == 0) && iVar21 == 0) && iVar18 == 0));
      local_1a0 = pbVar15 + 4;
      local_1f8.ptr = (char *)local_150;
      local_1b8 = local_170;
      local_188 = local_120;
      pbVar15 = local_1a0 + local_140 * 2;
      pbVar26 = local_1a0 + local_140;
      pbVar19 = local_1a0 + (long)local_1d0;
    }
    local_1d0 = pbVar19;
    local_108.ip[0] = local_168;
    local_1c8 = (undefined1  [8])local_148;
    local_198 = (undefined1  [8])local_160;
    pbVar19 = local_1d0;
    local_130 = pbVar25;
  }
  local_1d0 = pbVar19;
  if (local_138 < local_1a0) {
    return 0xffffffffffffffec;
  }
  if (local_128 < pbVar26) {
    return 0xffffffffffffffec;
  }
  if (pbVar25 < pbVar15) {
    return 0xffffffffffffffec;
  }
  if (3 < (long)local_138 - (long)local_1a0) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if ((uint)local_108.ip[1] < 0x41) {
        if (local_108.ip[2] < local_108.op[0]) {
          if (local_108.ip[2] == local_108.ip[3]) goto LAB_00855501;
          bVar29 = local_108.ip[3] <=
                   (ushort *)((long)local_108.ip[2] - (ulong)((uint)local_108.ip[1] >> 3));
          uVar24 = (int)local_108.ip[2] - (int)local_108.ip[3];
          if (bVar29) {
            uVar24 = (uint)local_108.ip[1] >> 3;
          }
          local_108.ip[2] = (BYTE *)((long)local_108.ip[2] - (ulong)uVar24);
          local_108.ip[1]._0_4_ = (uint)local_108.ip[1] + uVar24 * -8;
          local_108.ip[0] = *(BYTE **)local_108.ip[2];
        }
        else {
          local_108.ip[2] = (BYTE *)((long)local_108.ip[2] - (ulong)((uint)local_108.ip[1] >> 3));
          local_108.ip[1]._0_4_ = (uint)local_108.ip[1] & 7;
          local_108.ip[0] = *(BYTE **)local_108.ip[2];
          bVar29 = true;
        }
      }
      else {
LAB_00855501:
        bVar29 = false;
      }
      if ((local_138 + -3 <= local_1a0) || (!bVar29)) goto LAB_00855742;
      if (cVar20 == '\0') goto LAB_00855eee;
      uVar16 = (ulong)((long)local_108.ip[0] << ((byte)(uint)local_108.ip[1] & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)local_108.ip[1];
      *local_1a0 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_108.ip[0] << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      local_1a0[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_108.ip[0] << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      local_1a0[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_108.ip[0] << ((byte)iVar7 & 0x3f)) >> bVar10;
      local_108.ip[1]._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      local_1a0[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      local_1a0 = local_1a0 + 4;
    } while( true );
  }
  if ((uint)local_108.ip[1] < 0x41) {
    if (local_108.ip[2] < local_108.op[0]) {
      if (local_108.ip[2] != local_108.ip[3]) {
        uVar24 = (int)local_108.ip[2] - (int)local_108.ip[3];
        if (local_108.ip[3] <=
            (ushort *)((long)local_108.ip[2] - (ulong)((uint)local_108.ip[1] >> 3))) {
          uVar24 = (uint)local_108.ip[1] >> 3;
        }
        local_108.ip[2] = (BYTE *)((long)local_108.ip[2] - (ulong)uVar24);
        local_108.ip[1]._0_4_ = (uint)local_108.ip[1] + uVar24 * -8;
        local_108.ip[0] = *(BYTE **)local_108.ip[2];
      }
    }
    else {
      local_130 = pbVar25;
      BIT_reloadDStreamFast((BIT_DStream_t *)&local_108);
      pbVar25 = local_130;
    }
  }
LAB_00855742:
  cVar20 = (char)local_158;
  if (local_1a0 < local_138) {
    if (cVar20 == '\0') goto LAB_00855eee;
    pbVar19 = local_1a0;
    do {
      uVar16 = (ulong)((long)local_108.ip[0] << ((byte)(uint)local_108.ip[1] & 0x3f)) >>
               (-cVar20 & 0x3fU);
      local_108.ip[1]._0_4_ = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)local_108.ip[1];
      *pbVar19 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 < local_138);
  }
  if (3 < (long)local_128 - (long)pbVar26) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if (local_1f8.bitsConsumed < 0x41) {
        if (local_1f8.ptr < local_1f8.limitPtr) {
          if (local_1f8.ptr == local_1f8.start) goto LAB_008557cb;
          bVar29 = local_1f8.start <=
                   (ulong *)((long)local_1f8.ptr - (ulong)(local_1f8.bitsConsumed >> 3));
          uVar24 = (int)local_1f8.ptr - (int)local_1f8.start;
          if (bVar29) {
            uVar24 = local_1f8.bitsConsumed >> 3;
          }
          local_1f8.ptr = (char *)((long)local_1f8.ptr - (ulong)uVar24);
          local_1f8.bitsConsumed = local_1f8.bitsConsumed + uVar24 * -8;
          local_1f8.bitContainer = *(size_t *)local_1f8.ptr;
        }
        else {
          local_1f8.ptr = (char *)((long)local_1f8.ptr - (ulong)(local_1f8.bitsConsumed >> 3));
          local_1f8.bitsConsumed = local_1f8.bitsConsumed & 7;
          local_1f8.bitContainer = *(size_t *)local_1f8.ptr;
          bVar29 = true;
        }
      }
      else {
LAB_008557cb:
        bVar29 = false;
      }
      if ((local_128 + -3 <= pbVar26) || (!bVar29)) goto LAB_0085598e;
      if (cVar20 == '\0') goto LAB_00855eee;
      uVar16 = (local_1f8.bitContainer << ((byte)local_1f8.bitsConsumed & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + local_1f8.bitsConsumed;
      *pbVar26 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (local_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar26[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (local_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar26[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (local_1f8.bitContainer << ((byte)iVar7 & 0x3f)) >> bVar10;
      local_1f8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar26[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar26 = pbVar26 + 4;
    } while( true );
  }
  if (local_1f8.bitsConsumed < 0x41) {
    if (local_1f8.ptr < local_1f8.limitPtr) {
      if (local_1f8.ptr != local_1f8.start) {
        uVar24 = (int)local_1f8.ptr - (int)local_1f8.start;
        if (local_1f8.start <= (ulong *)((long)local_1f8.ptr - (ulong)(local_1f8.bitsConsumed >> 3))
           ) {
          uVar24 = local_1f8.bitsConsumed >> 3;
        }
        local_1f8.ptr = (char *)((long)local_1f8.ptr - (ulong)uVar24);
        local_1f8.bitsConsumed = local_1f8.bitsConsumed + uVar24 * -8;
        local_1f8.bitContainer = *(size_t *)local_1f8.ptr;
      }
    }
    else {
      local_130 = pbVar25;
      BIT_reloadDStreamFast(&local_1f8);
      pbVar25 = local_130;
    }
  }
LAB_0085598e:
  cVar20 = (char)local_158;
  if (pbVar26 < local_128) {
    if (cVar20 == '\0') goto LAB_00855eee;
    do {
      uVar16 = (local_1f8.bitContainer << ((byte)local_1f8.bitsConsumed & 0x3f)) >>
               (-cVar20 & 0x3fU);
      local_1f8.bitsConsumed = *(byte *)((long)DTable + uVar16 * 2 + 4) + local_1f8.bitsConsumed;
      *pbVar26 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 < local_128);
  }
  if (3 < (long)pbVar25 - (long)pbVar15) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if ((uint)uStack_1c0 < 0x41) {
        if (local_1b8 < local_1a8) {
          if (local_1b8 == puStack_1b0) goto LAB_00855a00;
          bVar29 = puStack_1b0 <= (ulong *)((long)local_1b8 - (ulong)((uint)uStack_1c0 >> 3));
          uVar24 = (int)local_1b8 - (int)puStack_1b0;
          if (bVar29) {
            uVar24 = (uint)uStack_1c0 >> 3;
          }
          local_1b8 = (ulong *)((long)local_1b8 - (ulong)uVar24);
          uStack_1c0._0_4_ = (uint)uStack_1c0 + uVar24 * -8;
          local_1c8 = (undefined1  [8])*local_1b8;
        }
        else {
          local_1b8 = (ulong *)((long)local_1b8 - (ulong)((uint)uStack_1c0 >> 3));
          uStack_1c0._0_4_ = (uint)uStack_1c0 & 7;
          local_1c8 = (undefined1  [8])*local_1b8;
          bVar29 = true;
        }
      }
      else {
LAB_00855a00:
        bVar29 = false;
      }
      if ((pbVar25 + -3 <= pbVar15) || (!bVar29)) goto LAB_00855bb5;
      if (cVar20 == '\0') goto LAB_00855eee;
      uVar16 = (ulong)((long)local_1c8 << ((byte)(uint)uStack_1c0 & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_1c0;
      *pbVar15 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_1c8 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar15[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_1c8 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar15[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_1c8 << ((byte)iVar7 & 0x3f)) >> bVar10;
      uStack_1c0._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      pbVar15[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar15 = pbVar15 + 4;
    } while( true );
  }
  if ((uint)uStack_1c0 < 0x41) {
    if (local_1b8 < local_1a8) {
      if (local_1b8 != puStack_1b0) {
        uVar24 = (int)local_1b8 - (int)puStack_1b0;
        if (puStack_1b0 <= (ulong *)((long)local_1b8 - (ulong)((uint)uStack_1c0 >> 3))) {
          uVar24 = (uint)uStack_1c0 >> 3;
        }
        local_1b8 = (ulong *)((long)local_1b8 - (ulong)uVar24);
        uStack_1c0._0_4_ = (uint)uStack_1c0 + uVar24 * -8;
        local_1c8 = (undefined1  [8])*local_1b8;
      }
    }
    else {
      BIT_reloadDStreamFast((BIT_DStream_t *)local_1c8);
    }
  }
LAB_00855bb5:
  cVar20 = (char)local_158;
  if (pbVar15 < pbVar25) {
    if (cVar20 == '\0') goto LAB_00855eee;
    do {
      uVar16 = (ulong)((long)local_1c8 << ((byte)(uint)uStack_1c0 & 0x3f)) >> (-cVar20 & 0x3fU);
      uStack_1c0._0_4_ = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_1c0;
      *pbVar15 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 < pbVar25);
  }
  if (3 < (long)pbVar28 - (long)local_1d0) {
    bVar10 = -cVar20 & 0x3f;
    do {
      if ((uint)uStack_190 < 0x41) {
        if (local_188 < local_178) {
          if (local_188 == pbStack_180) goto LAB_00855c20;
          bVar29 = pbStack_180 <= local_188 + -(ulong)((uint)uStack_190 >> 3);
          uVar24 = (int)local_188 - (int)pbStack_180;
          if (bVar29) {
            uVar24 = (uint)uStack_190 >> 3;
          }
          local_188 = local_188 + -(ulong)uVar24;
          uStack_190._0_4_ = (uint)uStack_190 + uVar24 * -8;
          local_198 = *(undefined1 (*) [8])local_188;
        }
        else {
          local_188 = local_188 + -(ulong)((uint)uStack_190 >> 3);
          uStack_190._0_4_ = (uint)uStack_190 & 7;
          local_198 = *(undefined1 (*) [8])local_188;
          bVar29 = true;
        }
      }
      else {
LAB_00855c20:
        bVar29 = false;
      }
      if ((local_110 <= local_1d0) || (!bVar29)) goto LAB_00855dce;
      if (cVar20 == '\0') goto LAB_00855eee;
      uVar16 = (ulong)((long)local_198 << ((byte)(uint)uStack_190 & 0x3f)) >> bVar10;
      iVar7 = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_190;
      *local_1d0 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_198 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      local_1d0[1] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_198 << ((byte)iVar7 & 0x3f)) >> bVar10;
      iVar7 = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      local_1d0[2] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      uVar16 = (ulong)((long)local_198 << ((byte)iVar7 & 0x3f)) >> bVar10;
      uStack_190._0_4_ = (uint)*(byte *)((long)DTable + uVar16 * 2 + 4) + iVar7;
      local_1d0[3] = *(byte *)((long)DTable + uVar16 * 2 + 5);
      local_1d0 = local_1d0 + 4;
    } while( true );
  }
  if ((uint)uStack_190 < 0x41) {
    if (local_188 < local_178) {
      if (local_188 != pbStack_180) {
        uVar24 = (int)local_188 - (int)pbStack_180;
        if (pbStack_180 <= local_188 + -(ulong)((uint)uStack_190 >> 3)) {
          uVar24 = (uint)uStack_190 >> 3;
        }
        local_188 = local_188 + -(ulong)uVar24;
        uStack_190._0_4_ = (uint)uStack_190 + uVar24 * -8;
        local_198 = *(undefined1 (*) [8])local_188;
      }
    }
    else {
      BIT_reloadDStreamFast((BIT_DStream_t *)local_198);
      cVar20 = (char)local_158;
    }
  }
LAB_00855dce:
  if (local_1d0 < pbVar28) {
    if (cVar20 == '\0') {
LAB_00855eee:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                    ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    do {
      uVar16 = (ulong)((long)local_198 << ((byte)(uint)uStack_190 & 0x3f)) >> (-cVar20 & 0x3fU);
      uStack_190._0_4_ = *(byte *)((long)DTable + uVar16 * 2 + 4) + (uint)uStack_190;
      *local_1d0 = *(byte *)((long)DTable + uVar16 * 2 + 5);
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 < pbVar28);
  }
  if ((uint)uStack_190 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_188 != pbStack_180) {
    dstSize = 0xffffffffffffffec;
  }
  if ((uint)uStack_1c0 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_1b8 != puStack_1b0) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_1f8.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_1f8.ptr != local_1f8.start) {
    dstSize = 0xffffffffffffffec;
  }
  if ((uint)local_108.ip[1] != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_108.ip[2] == local_108.ip[3]) {
    return dstSize;
  }
  return 0xffffffffffffffec;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}